

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text-slice.cc
# Opt level: O3

Point __thiscall TextSlice::position_for_offset(TextSlice *this,uint32_t offset,uint32_t min_row)

{
  Text *this_00;
  size_t sVar1;
  Point PVar2;
  Point local_28;
  
  this_00 = this->text;
  sVar1 = start_offset(this);
  local_28 = Text::position_for_offset
                       (this_00,offset + (int)sVar1,min_row + (this->start_position).row,true);
  PVar2 = Point::traversal(&local_28,&this->start_position);
  return PVar2;
}

Assistant:

Point TextSlice::position_for_offset(uint32_t offset, uint32_t min_row) const {
  return text->position_for_offset(
    offset + start_offset(),
    start_position.row + min_row
  ).traversal(start_position);
}